

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::directory(Fl_File_Chooser *this,char *d)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_20;
  char *dirptr;
  char *d_local;
  Fl_File_Chooser *this_local;
  
  dirptr = d;
  if (d == (char *)0x0) {
    dirptr = ".";
  }
  if (*dirptr == '\0') {
    this->directory_[0] = '\0';
  }
  else {
    if ((*dirptr == '/') || (*dirptr == '\\')) {
      fl_strlcpy(this->directory_,dirptr,0x800);
    }
    else {
      fl_filename_absolute(this->directory_,dirptr);
    }
    sVar2 = strlen(this->directory_);
    pcVar3 = this->directory_ + (sVar2 - 1);
    if (((*pcVar3 == '/') || (*pcVar3 == '\\')) && (this->directory_ < pcVar3)) {
      *pcVar3 = '\0';
    }
    sVar2 = strlen(this->directory_);
    local_20 = this->directory_ + (sVar2 - 3);
    if ((local_20 < this->directory_) || (iVar1 = strcmp(local_20,"/.."), iVar1 != 0)) {
      if ((this->directory_ <= this->directory_ + (sVar2 - 2)) &&
         (iVar1 = strcmp(this->directory_ + (sVar2 - 2),"/."), iVar1 == 0)) {
        this->directory_[sVar2 - 2] = '\0';
      }
    }
    else {
      *local_20 = '\0';
      for (; (this->directory_ < local_20 && (*local_20 != '/')); local_20 = local_20 + -1) {
      }
      if ((this->directory_ <= local_20) && (*local_20 == '/')) {
        *local_20 = '\0';
      }
    }
  }
  iVar1 = shown(this);
  if (iVar1 != 0) {
    rescan(this);
  }
  return;
}

Assistant:

void
Fl_File_Chooser::directory(const char *d)// I - Directory to change to
{
  char	*dirptr;			// Pointer into directory


//  printf("Fl_File_Chooser::directory(\"%s\")\n", d == NULL ? "(null)" : d);

  // NULL == current directory
  if (d == NULL)
    d = ".";

#ifdef WIN32
  // See if the filename contains backslashes...
  char	*slash;				// Pointer to slashes
  char	fixpath[FL_PATH_MAX];			// Path with slashes converted
  if (strchr(d, '\\')) {
    // Convert backslashes to slashes...
    strlcpy(fixpath, d, sizeof(fixpath));

    for (slash = strchr(fixpath, '\\'); slash; slash = strchr(slash + 1, '\\'))
      *slash = '/';

    d = fixpath;
  }
#endif // WIN32

  if (d[0] != '\0')
  {
    // Make the directory absolute...
#if (defined(WIN32) && ! defined(__CYGWIN__))|| defined(__EMX__)
    if (d[0] != '/' && d[0] != '\\' && d[1] != ':')
#else
    if (d[0] != '/' && d[0] != '\\')
#endif /* WIN32 || __EMX__ */
      fl_filename_absolute(directory_, d);
    else
      strlcpy(directory_, d, sizeof(directory_));

    // Strip any trailing slash...
    dirptr = directory_ + strlen(directory_) - 1;
    if ((*dirptr == '/' || *dirptr == '\\') && dirptr > directory_)
      *dirptr = '\0';

    // See if we have a trailing .. or . in the filename...
    dirptr = directory_ + strlen(directory_) - 3;
    if (dirptr >= directory_ && strcmp(dirptr, "/..") == 0) {
      // Yes, we have "..", so strip the trailing path...
      *dirptr = '\0';
      while (dirptr > directory_) {
        if (*dirptr == '/') break;
	dirptr --;
      }

      if (dirptr >= directory_ && *dirptr == '/')
        *dirptr = '\0';
    } else if ((dirptr + 1) >= directory_ && strcmp(dirptr + 1, "/.") == 0) {
      // Strip trailing "."...
      dirptr[1] = '\0';
    }
  }
  else
    directory_[0] = '\0';

  if (shown()) {
    // Rescan the directory...
    rescan();
  }
}